

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  size_t length,semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  int iVar1;
  uint8_t buf [1];
  binary_stream_sink *this_00;
  byte ch;
  long lVar2;
  uint8_t buf_1 [2];
  ulong local_20;
  ulong local_18;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  local_18 = length;
  if (iVar1 < *(int *)((this->options_)._vptr_cbor_encode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_cbor_encode_options)) {
    local_20 = local_20 & 0xffffffff00000000;
    std::
    vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::cbor::cbor_container_type,unsigned_long&>
              ((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
                *)&this->stack_,(cbor_container_type *)&local_20,&local_18);
    if (local_18 < 0x18) {
      ch = (byte)local_18 | 0xa0;
    }
    else {
      if (0xff < local_18) {
        if (local_18 < 0x10000) {
          binary_stream_sink::push_back(&this->sink_,0xb9);
          local_20 = CONCAT62(local_20._2_6_,(ushort)local_18 << 8 | (ushort)local_18 >> 8);
          lVar2 = 0;
          do {
            binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_20 + lVar2));
            lVar2 = lVar2 + 1;
          } while (lVar2 != 2);
          return true;
        }
        this_00 = &this->sink_;
        if (local_18 >> 0x20 == 0) {
          binary_stream_sink::push_back(this_00,0xba);
          local_20 = CONCAT44(local_20._4_4_,
                              (uint)local_18 >> 0x18 | ((uint)local_18 & 0xff0000) >> 8 |
                              ((uint)local_18 & 0xff00) << 8 | (uint)local_18 << 0x18);
          lVar2 = 0;
          do {
            binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_20 + lVar2));
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          return true;
        }
        binary_stream_sink::push_back(this_00,0xbb);
        local_20 = local_18 >> 0x38 | (local_18 & 0xff000000000000) >> 0x28 |
                   (local_18 & 0xff0000000000) >> 0x18 | (local_18 & 0xff00000000) >> 8 |
                   (local_18 & 0xff000000) << 8 | (local_18 & 0xff0000) << 0x18 |
                   (local_18 & 0xff00) << 0x28 | local_18 << 0x38;
        lVar2 = 0;
        do {
          binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_20 + lVar2));
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
        return true;
      }
      binary_stream_sink::push_back(&this->sink_,0xb8);
      ch = (byte)local_18;
    }
    binary_stream_sink::push_back(&this->sink_,ch);
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(std::size_t length, semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = cbor_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(cbor_container_type::object, length);

        if (length <= 0x17)
        {
            binary::native_to_big(static_cast<uint8_t>(0xa0 + length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xb8), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xb9), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xba), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0xbb), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                  std::back_inserter(sink_));
        }

        JSONCONS_VISITOR_RETURN;
    }